

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O1

bool __thiscall pstore::command_line::option::is_satisfied(option *this)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = (*this->_vptr_option[3])();
  if (iVar1 == 3) {
    bVar2 = 1 < this->num_occurrences_;
  }
  else {
    bVar2 = true;
    if (iVar1 == 2) {
      bVar2 = this->num_occurrences_ != 0;
    }
  }
  return bVar2;
}

Assistant:

bool option::is_satisfied () const {
                bool result = true;
                switch (this->get_num_occurrences_flag ()) {
                case num_occurrences_flag::required: result = num_occurrences_ >= 1U; break;
                case num_occurrences_flag::one_or_more: result = num_occurrences_ > 1U; break;
                case num_occurrences_flag::optional:
                case num_occurrences_flag::zero_or_more: break;
                }
                return result;
            }